

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptorTables * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateFileTables(Tables *this)

{
  FileDescriptorTables *__args;
  FileDescriptorTables *result;
  FileDescriptorTables *in_stack_00000080;
  vector<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  __args = (FileDescriptorTables *)operator_new(0x1d8);
  FileDescriptorTables::FileDescriptorTables(in_stack_00000080);
  std::
  vector<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>>>
  ::emplace_back<google::protobuf::FileDescriptorTables*&>
            (in_stack_ffffffffffffffe0,(FileDescriptorTables **)__args);
  return __args;
}

Assistant:

FileDescriptorTables* DescriptorPool::Tables::AllocateFileTables() {
  FileDescriptorTables* result = new FileDescriptorTables;
  file_tables_.emplace_back(result);
  return result;
}